

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O1

errr finish_parse_monster(parser *p)

{
  monster_race *pmVar1;
  ushort uVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  monster_blow *pmVar5;
  blow_method *pbVar6;
  blow_effect *pbVar7;
  long lVar8;
  long lVar9;
  undefined8 *p_00;
  angband_constants *paVar10;
  monster_lore *pmVar11;
  uint16_t uVar12;
  wchar_t wVar13;
  long *plVar14;
  undefined8 *puVar15;
  monster_blow *pmVar16;
  void *pvVar17;
  monster_race *pmVar18;
  monster_blow *pmVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  monster_friends *pmVar25;
  monster_shape *pmVar26;
  
  paVar10 = z_info;
  z_info->r_max = 0;
  paVar10->mon_blows_max = 0;
  plVar14 = (long *)parser_priv(p);
  paVar10 = z_info;
  if (plVar14 != (long *)0x0) {
    uVar12 = z_info->r_max;
    uVar23 = (uint)z_info->mon_blows_max;
    do {
      uVar24 = 0;
      for (puVar15 = (undefined8 *)plVar14[0xf]; puVar15 != (undefined8 *)0x0;
          puVar15 = (undefined8 *)*puVar15) {
        uVar24 = uVar24 + 1;
      }
      if ((uVar23 & 0xffff) < uVar24) {
        paVar10->mon_blows_max = (uint16_t)uVar24;
        uVar23 = uVar24;
      }
      uVar12 = uVar12 + 1;
      plVar14 = (long *)*plVar14;
    } while (plVar14 != (long *)0x0);
    paVar10->r_max = uVar12;
  }
  r_info = (monster_race *)mem_zalloc((ulong)z_info->r_max * 0xd0 + 0xd0);
  uVar2 = z_info->r_max;
  puVar15 = (undefined8 *)parser_priv(p);
  uVar20 = (ulong)uVar2;
  pmVar1 = r_info;
  do {
    r_info = pmVar1;
    if (puVar15 == (undefined8 *)0x0) {
      uVar12 = z_info->r_max + 1;
      z_info->r_max = uVar12;
      if (uVar12 == 0) {
        uVar22 = 0;
      }
      else {
        uVar20 = 0;
        do {
          pmVar1 = r_info + uVar20;
          for (pmVar25 = r_info[uVar20].friends; pmVar25 != (monster_friends *)0x0;
              pmVar25 = pmVar25->next) {
            wVar13 = my_stricmp(pmVar25->name,"same");
            pmVar18 = pmVar1;
            if (wVar13 != L'\0') {
              pmVar18 = lookup_monster(pmVar25->name);
            }
            pmVar25->race = pmVar18;
            if (pmVar18 == (monster_race *)0x0) {
              quit_fmt("Couldn\'t find friend named \'%s\' for monster \'%s\'",pmVar25->name,
                       pmVar1->name);
            }
            string_free(pmVar25->name);
          }
          for (pmVar26 = pmVar1->shapes; pmVar26 != (monster_shape *)0x0; pmVar26 = pmVar26->next) {
            if (pmVar26->base == (monster_base *)0x0) {
              pmVar18 = lookup_monster(pmVar26->name);
              pmVar26->race = pmVar18;
              if (pmVar18 == (monster_race *)0x0) {
                quit_fmt("Couldn\'t find shape named \'%s\' for monster \'%s\'",pmVar26->name,
                         pmVar1->name);
              }
            }
            string_free(pmVar26->name);
          }
          uVar20 = uVar20 + 1;
          uVar22 = (ulong)z_info->r_max;
        } while (uVar20 < uVar22);
      }
      l_list = (monster_lore *)mem_zalloc(uVar22 * 0x78);
      if (z_info->r_max != 0) {
        lVar21 = 0x68;
        uVar20 = 0;
        do {
          pmVar11 = l_list;
          pvVar17 = mem_zalloc((ulong)z_info->mon_blows_max * 0x30);
          *(void **)(pmVar11->flags + lVar21 + -0x70) = pvVar17;
          pvVar17 = mem_zalloc((ulong)z_info->mon_blows_max);
          *(void **)(pmVar11->flags + lVar21 + -0x20) = pvVar17;
          uVar20 = uVar20 + 1;
          lVar21 = lVar21 + 0x78;
        } while (uVar20 < z_info->r_max);
      }
      parser_destroy(p);
      return 0;
    }
    if ((long)uVar20 < 1) {
      __assert_fail("ridx >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                    ,0x6ef,"errr finish_parse_monster(struct parser *)");
    }
    uVar22 = uVar20 - 1;
    memcpy(pmVar1 + uVar22,puVar15,0xd0);
    pmVar1[uVar22].ridx = (uint)uVar22;
    puVar3 = (undefined8 *)*puVar15;
    pmVar18 = pmVar1 + uVar20;
    if ((long)(ulong)z_info->r_max <= (long)uVar20) {
      pmVar18 = (monster_race *)0x0;
    }
    pmVar1[uVar22].next = pmVar18;
    pmVar16 = (monster_blow *)mem_zalloc((ulong)z_info->mon_blows_max * 0x30);
    plVar14 = (long *)puVar15[0xf];
    if (plVar14 != (long *)0x0) {
      if (z_info->mon_blows_max != 0) {
        uVar20 = 0;
        pmVar19 = pmVar16;
        do {
          pmVar5 = (monster_blow *)*plVar14;
          pbVar6 = (blow_method *)plVar14[1];
          pbVar7 = (blow_effect *)plVar14[2];
          lVar21 = plVar14[3];
          lVar8 = plVar14[4];
          lVar9 = plVar14[5];
          (pmVar19->dice).sides = (int)lVar8;
          (pmVar19->dice).m_bonus = (int)((ulong)lVar8 >> 0x20);
          *(long *)&pmVar19->times_seen = lVar9;
          pmVar19->effect = pbVar7;
          (pmVar19->dice).base = (int)lVar21;
          (pmVar19->dice).dice = (int)((ulong)lVar21 >> 0x20);
          pmVar19->next = pmVar5;
          pmVar19->method = pbVar6;
          plVar14 = (long *)*plVar14;
          if (plVar14 == (long *)0x0) break;
          uVar20 = uVar20 + 1;
          pmVar19 = pmVar19 + 1;
        } while (uVar20 < z_info->mon_blows_max);
      }
      if (z_info->mon_blows_max != 0) {
        uVar20 = 0;
        pmVar19 = pmVar16;
        do {
          if (pmVar19->next != (monster_blow *)0x0) {
            pmVar19->next = pmVar19 + 1;
          }
          uVar20 = uVar20 + 1;
          pmVar19 = pmVar19 + 1;
        } while (uVar20 < z_info->mon_blows_max);
      }
      p_00 = (undefined8 *)puVar15[0xf];
      while (p_00 != (undefined8 *)0x0) {
        puVar4 = (undefined8 *)*p_00;
        mem_free(p_00);
        p_00 = puVar4;
      }
    }
    r_info[uVar22].blow = pmVar16;
    mem_free(puVar15);
    puVar15 = puVar3;
    uVar20 = uVar22;
    pmVar1 = r_info;
  } while( true );
}

Assistant:

static errr finish_parse_monster(struct parser *p) {
	struct monster_race *r, *n;
	size_t i;
	int ridx;

	/* Scan the list for the max id and max blows */
	z_info->r_max = 0;
	z_info->mon_blows_max = 0;
	r = parser_priv(p);
	while (r) {
		int max_blows = 0;
		struct monster_blow *b = r->blow;
		z_info->r_max++;
		while (b) {
			b = b->next;
			max_blows++;
		}
		if (max_blows > z_info->mon_blows_max)
			z_info->mon_blows_max = max_blows;
		r = r->next;
	}

	/* Allocate the direct access list and copy the race records to it */
	r_info = mem_zalloc((z_info->r_max + 1) * sizeof(*r));
	ridx = z_info->r_max - 1;
	for (r = parser_priv(p); r; r = n, ridx--) {
		struct monster_blow *b_new;

		assert(ridx >= 0);

		/* Main record */
		memcpy(&r_info[ridx], r, sizeof(*r));
		r_info[ridx].ridx = ridx;
		n = r->next;
		if (ridx < z_info->r_max - 1)
			r_info[ridx].next = &r_info[ridx + 1];
		else
			r_info[ridx].next = NULL;

		/* Blows */
		b_new = mem_zalloc(z_info->mon_blows_max * sizeof(*b_new));
		if (r->blow) {
			struct monster_blow *b_temp, *b_old = r->blow;

			/* Allocate space and copy */
			for (i = 0; i < z_info->mon_blows_max; i++) {
				memcpy(&b_new[i], b_old, sizeof(*b_old));
				b_old = b_old->next;
				if (!b_old) break;
			}

			/* Make next point correctly */
			for (i = 0; i < z_info->mon_blows_max; i++)
				if (b_new[i].next)
					b_new[i].next = &b_new[i + 1];

			/* Tidy up */
			b_old = r->blow;
			b_temp = b_old;
			while (b_temp) {
				b_temp = b_old->next;
				mem_free(b_old);
				b_old = b_temp;
			}
		}
		r_info[ridx].blow = b_new;

		mem_free(r);
	}
	z_info->r_max += 1;

	/* Convert friend and shape names into race pointers */
	for (i = 0; i < z_info->r_max; i++) {
		struct monster_race *race = &r_info[i];
		struct monster_friends *f;
		struct monster_shape *s;
		for (f = race->friends; f; f = f->next) {
			if (!my_stricmp(f->name, "same")) {
				f->race = race;
			} else {
				f->race = lookup_monster(f->name);
			}
			if (!f->race) {
				quit_fmt("Couldn't find friend named '%s' for monster '%s'",
						 f->name, race->name);
			}
			string_free(f->name);
		}
		for (s = race->shapes; s; s = s->next) {
			if (!s->base) {
				s->race = lookup_monster(s->name);
				if (!s->race) {
					quit_fmt("Couldn't find shape named '%s' for monster '%s'",
							 s->name, race->name);
				}
			}
			string_free(s->name);
		}
	}

	/* Allocate space for the monster lore */
	l_list = mem_zalloc(z_info->r_max * sizeof(struct monster_lore));
	for (i = 0; i < z_info->r_max; i++) {
		struct monster_lore *l = &l_list[i];
		l->blows = mem_zalloc(z_info->mon_blows_max * sizeof(struct monster_blow));
		l->blow_known = mem_zalloc(z_info->mon_blows_max * sizeof(bool));
	}

	parser_destroy(p);
	return 0;
}